

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O1

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
::vine_swap(Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
            *this,Index columnIndex1,Index columnIndex2)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
  *pIVar1;
  uint uVar2;
  uint uVar3;
  Pos_index PVar4;
  Pos_index PVar5;
  ID_index IVar6;
  Dimension DVar7;
  uint uVar8;
  pointer puVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
  *pCVar13;
  bool bVar14;
  Pos_index PVar15;
  Pos_index PVar16;
  Index IVar17;
  pointer p;
  long *plVar18;
  invalid_argument *this_00;
  long *plVar19;
  int iVar20;
  ulong uVar21;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
  *pIVar22;
  anon_class_1_0_00000001 local_5c;
  anon_class_1_0_00000001 local_5b;
  anon_class_1_0_00000001 local_5a;
  anon_class_1_0_00000001 local_59;
  long local_58;
  Index local_4c;
  Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
  *local_48;
  long local_40;
  anon_class_8_1_e4bd5e45 local_38;
  
  puVar9 = (this->super_type).pivotToPosition_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar10 = (long)this[1].super_type.
                 super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                 .barcode_.
                 super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (ulong)columnIndex1 * 0x30;
  local_58 = (ulong)columnIndex2 * 0x30;
  uVar2 = puVar9[*(uint *)(lVar10 + 4 + local_40)];
  uVar3 = puVar9[*(uint *)(lVar10 + 4 + local_58)];
  iVar20 = uVar2 - uVar3;
  if (uVar2 < uVar3) {
    iVar20 = -(uVar2 - uVar3);
  }
  local_4c = columnIndex2;
  if (iVar20 != 1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,
               "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the \'real\' matrix."
              );
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  lVar11 = (ulong)columnIndex1 * 0x30;
  uVar2 = *(uint *)((long)this[1].super_type.
                          super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                          .barcode_.
                          super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4 + lVar11);
  PVar4 = puVar9[uVar2];
  local_48 = this;
  PVar15 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
           ::death(&this->super_type,uVar2);
  lVar12 = (ulong)columnIndex2 * 0x30;
  uVar2 = *(uint *)((long)local_48[1].super_type.
                          super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                          .barcode_.
                          super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4 + lVar12);
  PVar5 = (local_48->super_type).pivotToPosition_.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar2];
  PVar16 = Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
           ::death(&local_48->super_type,uVar2);
  pCVar13 = local_48;
  lVar10 = (long)local_48[1].super_type.
                 super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                 .barcode_.
                 super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = *(uint *)(lVar10 + 4 + lVar11);
  plVar19 = (long *)(lVar10 + lVar12 + 0x20);
  if ((PVar15 == PVar4) && (plVar18 = plVar19, PVar16 == PVar5)) {
    do {
      plVar18 = (long *)*plVar18;
      if (plVar18 == plVar19) goto LAB_001694a4;
      if (plVar18 == (long *)0x0) {
LAB_00169707:
        __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                      "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<Chain_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, false, false, true>>::Matrix_column_tag, Type = 1]"
                     );
      }
    } while (*(uint *)(plVar18 + 2) != uVar2);
    if (plVar18 != plVar19) {
      IVar17 = _negative_vine_swap(local_48,columnIndex1,local_4c);
      return IVar17;
    }
LAB_001694a4:
    uVar3 = *(uint *)(lVar10 + 4 + local_58);
    uVar21 = (ulong)uVar3;
    Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
    ::negative_transpose(&local_48->super_type,uVar2,uVar3);
  }
  else {
    plVar18 = plVar19;
    if (PVar15 == PVar4) {
      do {
        plVar18 = (long *)*plVar18;
        if (plVar18 == plVar19) goto LAB_001695a3;
        if (plVar18 == (long *)0x0) goto LAB_00169707;
      } while (*(uint *)(plVar18 + 2) != uVar2);
      if (plVar18 != plVar19) {
        lVar10 = (long)local_48[1].super_type.
                       super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                       .barcode_.
                       super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                  *)(lVar10 + local_40);
        uVar2 = *(uint *)(lVar10 + 4 + local_40);
        pIVar22 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                   *)(lVar10 + local_58);
        local_38.targetColumn = pIVar1;
        bVar14 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_column___persistence_matrix::Column_types)7,false,true,false,false,true>>__Matrix_column_tag_1u>_false>___1_>
                           (pIVar22,pIVar1,&local_59,&local_38,&local_5a,&local_5b,&local_5c);
        if (bVar14) {
          IVar6 = (pIVar1->super_Chain_column_option).pivot_;
          (pIVar1->super_Chain_column_option).pivot_ = (pIVar22->super_Chain_column_option).pivot_;
          (pIVar22->super_Chain_column_option).pivot_ = IVar6;
          DVar7 = (pIVar1->super_Column_dimension_option).dim_;
          (pIVar1->super_Column_dimension_option).dim_ =
               (pIVar22->super_Column_dimension_option).dim_;
          (pIVar22->super_Column_dimension_option).dim_ = DVar7;
        }
        uVar3 = (pIVar1->super_Chain_column_option).pivot_;
        if (uVar2 != uVar3) {
          puVar9 = local_48[1].super_type.
                   super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                   .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar8 = puVar9[uVar2];
          puVar9[uVar2] = puVar9[uVar3];
          puVar9[uVar3] = uVar8;
        }
        puVar9 = (local_48->super_type).pivotToPosition_.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar10 = (long)local_48[1].super_type.
                       super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                       .barcode_.
                       super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = *(uint *)(lVar10 + 4 + local_40);
        uVar3 = *(uint *)(lVar10 + 4 + local_58);
        uVar8 = puVar9[uVar2];
        puVar9[uVar2] = puVar9[uVar3];
        puVar9[uVar3] = uVar8;
        return local_4c;
      }
LAB_001695a3:
      uVar3 = *(uint *)(lVar10 + 4 + local_58);
      uVar21 = (ulong)uVar3;
      Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
      ::negative_positive_transpose(&local_48->super_type,uVar2,uVar3);
    }
    else if (PVar16 == PVar5) {
      do {
        plVar18 = (long *)*plVar18;
        if (plVar18 == plVar19) goto LAB_001696c8;
        if (plVar18 == (long *)0x0) goto LAB_00169707;
      } while (*(uint *)(plVar18 + 2) != uVar2);
      if (plVar18 != plVar19) {
        lVar10 = (long)local_48[1].super_type.
                       super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                       .barcode_.
                       super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                  *)(lVar10 + local_58);
        uVar2 = *(uint *)(lVar10 + 4 + local_58);
        pIVar22 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                   *)(lVar10 + local_40);
        local_38.targetColumn = pIVar1;
        bVar14 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_column___persistence_matrix::Column_types)7,false,true,false,false,true>>__Matrix_column_tag_1u>_false>___1_>
                           (pIVar22,pIVar1,&local_59,&local_38,&local_5a,&local_5b,&local_5c);
        pCVar13 = local_48;
        if (bVar14) {
          IVar6 = (pIVar1->super_Chain_column_option).pivot_;
          (pIVar1->super_Chain_column_option).pivot_ = (pIVar22->super_Chain_column_option).pivot_;
          (pIVar22->super_Chain_column_option).pivot_ = IVar6;
          DVar7 = (pIVar1->super_Column_dimension_option).dim_;
          (pIVar1->super_Column_dimension_option).dim_ =
               (pIVar22->super_Column_dimension_option).dim_;
          (pIVar22->super_Column_dimension_option).dim_ = DVar7;
        }
        uVar3 = (pIVar1->super_Chain_column_option).pivot_;
        if (uVar2 != uVar3) {
          puVar9 = local_48[1].super_type.
                   super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                   .indexToBar_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar8 = puVar9[uVar2];
          puVar9[uVar2] = puVar9[uVar3];
          puVar9[uVar3] = uVar8;
        }
        lVar10 = (long)local_48[1].super_type.
                       super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                       .barcode_.
                       super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = *(uint *)(lVar10 + 4 + local_40);
        uVar3 = *(uint *)(lVar10 + 4 + local_58);
        Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
        ::positive_negative_transpose(&local_48->super_type,uVar2,uVar3);
        puVar9 = (pCVar13->super_type).pivotToPosition_.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = puVar9[uVar2];
        puVar9[uVar2] = puVar9[uVar3];
        puVar9[uVar3] = uVar8;
        return columnIndex1;
      }
LAB_001696c8:
      uVar3 = *(uint *)(lVar10 + 4 + local_58);
      uVar21 = (ulong)uVar3;
      Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
      ::positive_negative_transpose(&local_48->super_type,uVar2,uVar3);
    }
    else {
      do {
        plVar18 = (long *)*plVar18;
        if (plVar18 == plVar19) goto LAB_001696ae;
        if (plVar18 == (long *)0x0) goto LAB_00169707;
      } while (*(uint *)(plVar18 + 2) != uVar2);
      if (plVar18 != plVar19) {
        IVar17 = _positive_vine_swap(local_48,columnIndex1,local_4c);
        return IVar17;
      }
LAB_001696ae:
      uVar3 = *(uint *)(lVar10 + 4 + local_58);
      uVar21 = (ulong)uVar3;
      Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
      ::positive_transpose(&local_48->super_type,uVar2,uVar3);
    }
  }
  puVar9 = (pCVar13->super_type).pivotToPosition_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = puVar9[uVar2];
  puVar9[uVar2] = puVar9[uVar21];
  puVar9[uVar21] = uVar3;
  return columnIndex1;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::vine_swap(Index columnIndex1,
                                                                                                Index columnIndex2)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    GUDHI_CHECK(CP::are_adjacent(_matrix()->get_pivot(columnIndex1), _matrix()->get_pivot(columnIndex2)),
                std::invalid_argument(
                    "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the 'real' matrix."));
  }

  const bool col1IsNeg = _is_negative_in_pair(columnIndex1);
  const bool col2IsNeg = _is_negative_in_pair(columnIndex2);

  if (col1IsNeg && col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (col1IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_positive_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_positive_vine_swap(columnIndex1, columnIndex2);
  }

  if (col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::positive_negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _positive_negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
      ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

      CP::positive_transpose(pivot1, pivot2);
      CP::swap_positions(pivot1, pivot2);
    }
    return columnIndex1;
  }
  return _positive_vine_swap(columnIndex1, columnIndex2);
}